

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_lzma_bit(uchar *compressed,size_t compressed_size,uint16_t *prob,size_t *poffset,
                uint32_t *prange,uint32_t *pcode)

{
  ushort uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  short sVar5;
  uint uVar6;
  
  if ((*prange < 0x1000000) && (uVar4 = *poffset, uVar4 < compressed_size)) {
    *prange = *prange << 8;
    uVar2 = *pcode;
    *pcode = uVar2 << 8;
    *pcode = (uint)compressed[uVar4] | uVar2 << 8;
    *poffset = uVar4 + 1;
  }
  uVar1 = *prob;
  uVar6 = (*prange >> 0xb) * (uint)uVar1;
  uVar3 = *pcode;
  if (uVar6 <= uVar3) {
    *prange = *prange - uVar6;
    *pcode = *pcode - uVar6;
    sVar5 = -(uVar1 >> 5);
  }
  else {
    *prange = uVar6;
    sVar5 = (short)(0x800 - uVar1 >> 5);
  }
  *prob = sVar5 + uVar1;
  return (uint)(uVar6 <= uVar3);
}

Assistant:

static int
elf_lzma_bit (const unsigned char *compressed, size_t compressed_size,
	      uint16_t *prob, size_t *poffset, uint32_t *prange,
	      uint32_t *pcode)
{
  uint32_t bound;

  elf_lzma_range_normalize (compressed, compressed_size, poffset,
			    prange, pcode);
  bound = (*prange >> 11) * (uint32_t) *prob;
  if (*pcode < bound)
    {
      *prange = bound;
      *prob += ((1U << 11) - *prob) >> 5;
      return 0;
    }
  else
    {
      *prange -= bound;
      *pcode -= bound;
      *prob -= *prob >> 5;
      return 1;
    }
}